

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::clear
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this)

{
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  *in_RDI;
  lock_guard<std::mutex> lock;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb8;
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  *in_stack_ffffffffffffffe8;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
  std::
  function<bool(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry*,std::vector<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry>>>)>
  ::
  function<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::eraseEntries(std::function<bool(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry*,std::vector<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(),std::lock_guard<std::mutex>>::Entry>>>)>)::_default_arg_1_::_lambda(auto:1)_1_,void>
            (in_RDI,in_stack_ffffffffffffffb8);
  eraseEntries(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  ::~function((function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
               *)0x1035a9);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1035b3);
  return;
}

Assistant:

void clear() noexcept
  {
    Lock lock(entriesMutex);
    eraseEntries();
  }